

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void writeAltFmtO(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                 int spike)

{
  int iVar1;
  uint uVar2;
  char *incolor;
  undefined8 local_98;
  char *mast [7];
  char *local_58;
  char *prevColor;
  char *color;
  dotNode *node;
  int gn;
  int numGroups;
  int j;
  int i;
  int spike_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  int showEnd_local;
  int showBegin_local;
  FILE *outf_local;
  
  prevColor = "";
  memcpy(&local_98,&PTR_anon_var_dwarf_eca6_00154cd0,0x38);
  iVar1 = 2;
  if (showBegin != 0 && showEnd != 0) {
    iVar1 = 1;
  }
  uVar2 = 1;
  if (showBegin == 0 && showEnd != 0) {
    uVar2 = 2;
  }
  for (gn = 0; gn < 7; gn = gn + 1) {
    fprintf((FILE *)outf,"begin_object %s%d\n",mast[(long)gn + -1],(ulong)uVar2);
    fprintf((FILE *)outf,"mode solid\n");
    for (numGroups = 0; numGroups < 0x72; numGroups = numGroups + 1) {
      local_58 = "--none--";
      color = (char *)results[numGroups][gn];
      if ((dotNode *)color != (dotNode *)0x0) {
        incolor = getColor(numGroups);
        prevColor = convertKinColorToXV(incolor);
      }
      for (; color != (char *)0x0; color = *(char **)color) {
        if (ColorGap != 0) {
          if (*(long *)(color + 0x10) == 0) {
            prevColor = "124";
          }
          else {
            prevColor = assignGapColorForO(*(float *)(color + 0x4c),gn);
          }
        }
        if (prevColor != local_58) {
          fprintf((FILE *)outf,"colour %s\n",prevColor);
          local_58 = prevColor;
        }
        if ((((gn == 3) || (gn == 4)) || (gn == 5)) && (spike != 0)) {
          fprintf((FILE *)outf,"move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",
                  *(undefined8 *)(color + 0x18),*(undefined8 *)(color + 0x20),
                  *(undefined8 *)(color + 0x28),*(undefined8 *)(color + 0x30),
                  *(undefined8 *)(color + 0x38),*(undefined8 *)(color + 0x40));
        }
        else {
          fprintf((FILE *)outf,"sphere_xyz %.3f %.3f %.3f 0.03\n",*(undefined8 *)(color + 0x18),
                  *(undefined8 *)(color + 0x20),*(undefined8 *)(color + 0x28));
        }
      }
    }
    fprintf((FILE *)outf,"end_object\n");
  }
  if (showEnd != 0) {
    if (showBegin == 0) {
      fprintf((FILE *)outf,"begin_object contsurf\n");
    }
    else {
      fprintf((FILE *)outf,"begin_object %s\n",groupname);
    }
    for (gn = 0; gn < 7; gn = gn + 1) {
      for (numGroups = 0; numGroups < iVar1; numGroups = numGroups + 1) {
        fprintf((FILE *)outf,"instance %s%d\n",mast[(long)gn + -1],(ulong)(numGroups + 1));
      }
    }
    fprintf((FILE *)outf,"end_object\n");
  }
  return;
}

Assistant:

void writeAltFmtO(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j, numGroups, gn;
   dotNode *node;
   char *color = "", *prevColor = "";
   //Old: char *mast[NODEWIDTH] = {"WC", "CC", "SO", "BO", "HB"};
   char *mast[NODEWIDTH] = {"WC", "CC", "WH", "SO", "BO", "WO", "HB"}; /* 04/15/2015 SJ changed to match new NODEWIDTH, see probe.h*/
    
   numGroups = (showBegin && showEnd) ? 1 : 2;
   gn = (!showBegin && showEnd) ? 2 : 1;

   for (j = 0; j < NODEWIDTH; j++) {
      fprintf(outf, "begin_object %s%d\n", mast[j], gn);
      fprintf(outf, "mode solid\n");

      for (i = 0; i < NUMATOMTYPES; i++) {
	 prevColor = "--none--";
	 node = results[i][j];
	 if (node) {
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForO(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if (color != prevColor) {
	       fprintf(outf, "colour %s\n", color);
	       prevColor = color;
	    }
	    if ((j == 3 || j == 4 || j ==5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "sphere_xyz %.3f %.3f %.3f 0.03\n",
		  node->loc.x, node->loc.y, node->loc.z);
	    }
	    node = node->next;
	 }
      }
      fprintf(outf, "end_object\n");
   }

   if (showEnd) {
      if (showBegin) { fprintf(outf, "begin_object %s\n", groupname); }
      else           { fprintf(outf, "begin_object contsurf\n"); }
      for (j = 0; j < NODEWIDTH; j++) {
	 for (i = 0; i < numGroups; i++) {
	    fprintf(outf, "instance %s%d\n", mast[j], i+1);
	 }
      }
      fprintf(outf, "end_object\n");
   }
}